

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O1

void __thiscall Goal::solve(Goal *this,Program *prog,int level,VarMapping *vars)

{
  Trace *pTVar1;
  ostream *poVar2;
  Clause *this_00;
  Goal *this_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  Program *pPVar3;
  int iVar4;
  char *l;
  undefined4 extraout_var;
  
  iVar4 = level;
  if (0 < level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve@",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  print(this);
  l = "\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (prog != (Program *)0x0) {
    src = extraout_RDX;
    pPVar3 = prog;
    do {
      pTVar1 = Trace::history;
      iVar4 = Clause::copy(pPVar3->head,(EVP_PKEY_CTX *)l,src);
      this_00 = (Clause *)CONCAT44(extraout_var,iVar4);
      for (; Trace::history != pTVar1; Trace::history = Trace::history->tail) {
        Trace::history->head->instance = &Trace::history->head->super_Term;
      }
      iVar4 = level;
      if (0 < level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  try:",6);
      Clause::print(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      l = (char *)this_00->head;
      iVar4 = (*(this->head->super_Term)._vptr_Term[1])();
      if ((char)iVar4 == '\0') {
        iVar4 = level;
        if (0 < level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        l = "  nomatch.\n";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  nomatch.\n",0xb)
        ;
        src = extraout_RDX_00;
      }
      else {
        if (this_00->body == (Goal *)0x0) {
          this_01 = this->tail;
        }
        else {
          l = (char *)this->tail;
          this_01 = append(this_00->body,(Goal *)l);
        }
        if (this_01 == (Goal *)0x0) {
          VarMapping::show_answer(vars);
          src = extraout_RDX_02;
        }
        else {
          l = (char *)prog;
          solve(this_01,prog,level + 1,vars);
          src = extraout_RDX_01;
        }
      }
      for (; Trace::history != pTVar1; Trace::history = Trace::history->tail) {
        Trace::history->head->instance = &Trace::history->head->super_Term;
      }
      pPVar3 = pPVar3->tail;
    } while (pPVar3 != (Program *)0x0);
  }
  return;
}

Assistant:

void Goal::solve(Program *prog, int level, VarMapping *vars)
{
    indent(level);
    std::cout << "solve@" << level << ": ";
    this->print();
    std::cout << "\n";

    //
    // Iterate over the clauses of the program.
    //
    for (Program *iter = prog; iter; iter = iter->tail) {
        Trace *tr = Trace::Note();
        Clause *cl = iter->head->copy();
        Trace::Undo(tr);

        indent(level);
        std::cout << "  try:";
        cl->print();
        std::cout << "\n";

        // Match the goal to the clause head.
        if (head->unify(cl->head)) {

            // Matched: extend the goal with the clause body and solve it,
            // with the level incremented.
            Goal *gdash = cl->body ? cl->body->append(tail) : tail;
            if (gdash)
                gdash->solve(prog, level + 1, vars);
            else
                vars->show_answer();
        } else {
            indent(level);
            std::cout << "  nomatch.\n";
        }

        // Reset the variables bound at this iteration.
        Trace::Undo(tr);
    }
}